

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode connect_init(Curl_easy *data,_Bool reinit)

{
  connectdata *conn_00;
  CURLcode CVar1;
  CURLcode result;
  connectdata *conn;
  http_connect_state *s;
  _Bool reinit_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if ((conn_00->handler->flags & 0x4000) != 0) {
    Curl_failf(data,"%s cannot be done over CONNECT",conn_00->handler->scheme);
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  if (reinit) {
    conn = (connectdata *)conn_00->connect_state;
    Curl_dyn_reset((dynbuf *)&(conn->ssl_config).ssl_options);
  }
  else {
    CVar1 = Curl_get_upload_buffer(data);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    conn = (connectdata *)(*Curl_ccalloc)(1,0x358);
    if (conn == (connectdata *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(data,"allocate connect buffer");
    conn_00->connect_state = (http_connect_state *)conn;
    Curl_dyn_init((dynbuf *)&(conn->ssl_config).ssl_options,0x4000);
    (conn->ssl_config).curves = (char *)(data->req).p;
    (data->req).p.rtsp = (RTSP *)conn;
    Curl_conncontrol(conn_00,0);
  }
  *(undefined4 *)&(conn->proxy_ssl_config).ca_info_blob = 0;
  *(undefined4 *)&(conn->proxy_ssl_config).CRLfile = 1;
  (conn->proxy_ssl_config).cert_blob = (curl_blob *)0x0;
  *(byte *)((long)&(conn->proxy_ssl_config).ca_info_blob + 4) =
       *(byte *)((long)&(conn->proxy_ssl_config).ca_info_blob + 4) & 0xfd;
  return CURLE_OK;
}

Assistant:

static CURLcode connect_init(struct Curl_easy *data, bool reinit)
{
  struct http_connect_state *s;
  struct connectdata *conn = data->conn;
  if(conn->handler->flags & PROTOPT_NOTCPPROXY) {
    failf(data, "%s cannot be done over CONNECT", conn->handler->scheme);
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  if(!reinit) {
    CURLcode result;
    DEBUGASSERT(!conn->connect_state);
    /* we might need the upload buffer for streaming a partial request */
    result = Curl_get_upload_buffer(data);
    if(result)
      return result;

    s = calloc(1, sizeof(struct http_connect_state));
    if(!s)
      return CURLE_OUT_OF_MEMORY;
    infof(data, "allocate connect buffer");
    conn->connect_state = s;
    Curl_dyn_init(&s->rcvbuf, DYN_PROXY_CONNECT_HEADERS);

    /* Curl_proxyCONNECT is based on a pointer to a struct HTTP at the
     * member conn->proto.http; we want [protocol] through HTTP and we have
     * to change the member temporarily for connecting to the HTTP
     * proxy. After Curl_proxyCONNECT we have to set back the member to the
     * original pointer
     *
     * This function might be called several times in the multi interface case
     * if the proxy's CONNECT response is not instant.
     */
    s->prot_save = data->req.p.http;
    data->req.p.http = &s->http_proxy;
    connkeep(conn, "HTTP proxy CONNECT");
  }
  else {
    DEBUGASSERT(conn->connect_state);
    s = conn->connect_state;
    Curl_dyn_reset(&s->rcvbuf);
  }
  s->tunnel_state = TUNNEL_INIT;
  s->keepon = KEEPON_CONNECT;
  s->cl = 0;
  s->close_connection = FALSE;
  return CURLE_OK;
}